

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

int __thiscall
glcts::TessellationShaderTessellationTests::init
          (TessellationShaderTessellationTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParam;
  int extraout_EAX;
  TestCaseBase *pTVar1;
  TessellationShaderTessellationgl_TessCoord *pTVar2;
  
  pTVar1 = (TestCaseBase *)operator_new(0x2e0);
  extParam = &(this->super_TestCaseGroupBase).m_extParams;
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,
             "gl_InvocationID_PatchVerticesIn_PrimitiveID",
             "Verifies that gl_InvocationID, gl_PatchVerticesIn and gl_PrimitiveID are assigned correct values in TC and TE stages (where appropriate), when invoked with arrayed and indiced draw calls. Also verifies that restarting primitive topology does not restart primitive ID counter."
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)
       &PTR__TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID_021137b0;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar2 = (TessellationShaderTessellationgl_TessCoord *)operator_new(0x2e8);
  TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord
            (pTVar2,(this->super_TestCaseGroupBase).m_context,extParam,TESSELLATION_TEST_TYPE_FIRST)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TessellationShaderTessellationgl_TessCoord *)operator_new(0x2e8);
  TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord
            (pTVar2,(this->super_TestCaseGroupBase).m_context,extParam,TESSELLATION_TEST_TYPE_TES);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar1 = (TestCaseBase *)operator_new(0x2e0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"input_patch_discard",
             "Verifies that patches, for which relevant outer tessellation levels have been defined to 0 or less, are discard by the tessellation primitive  generator."
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTessellationInputPatchDiscard_02113768;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(800);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"max_in_out_attributes",
             "Make sure it is possible to use up GL_MAX_TESS_*_COMPONENTS_EXT.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02113868
  ;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
  *(undefined8 *)&pTVar1[1].super_TestCase.super_TestNode.m_nodeType = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TessellationShaderTessellationTests::init(void)
{
	addChild(
		new glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID(m_context, m_extParams));
	addChild(
		new glcts::TessellationShaderTessellationgl_TessCoord(m_context, m_extParams, TESSELLATION_TEST_TYPE_TCS_TES));
	addChild(new glcts::TessellationShaderTessellationgl_TessCoord(m_context, m_extParams, TESSELLATION_TEST_TYPE_TES));
	addChild(new glcts::TessellationShaderTessellationInputPatchDiscard(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTessellationMaxInOut(m_context, m_extParams));
}